

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O0

int bn_x2bn(BIGNUM **outp,char *in,decode_func decode,char_test_func want_char)

{
  int iVar1;
  int local_40;
  int num;
  int i;
  int neg;
  BIGNUM *ret;
  char_test_func want_char_local;
  decode_func decode_local;
  char *in_local;
  BIGNUM **outp_local;
  
  if ((in == (char *)0x0) || (*in == '\0')) {
    outp_local._4_4_ = 0;
  }
  else {
    decode_local = (decode_func)in;
    if (*in == '-') {
      decode_local = (decode_func)(in + 1);
    }
    num = (int)(*in == '-');
    for (local_40 = 0; iVar1 = (*want_char)(SUB14(decode_local[local_40],0)),
        iVar1 != 0 && local_40 + num < 0x7fffffff; local_40 = local_40 + 1) {
    }
    outp_local._4_4_ = local_40 + num;
    if (outp != (BIGNUM **)0x0) {
      if (*outp == (BIGNUM *)0x0) {
        _i = BN_new();
        if (_i == (BIGNUM *)0x0) {
          return 0;
        }
      }
      else {
        _i = (BIGNUM *)*outp;
        BN_zero((BIGNUM *)_i);
      }
      iVar1 = (*decode)((BIGNUM *)_i,(char *)decode_local,local_40);
      if (iVar1 == 0) {
        if (*outp == (BIGNUM *)0x0) {
          BN_free(_i);
        }
        outp_local._4_4_ = 0;
      }
      else {
        bn_set_minimal_width((BIGNUM *)_i);
        iVar1 = BN_is_zero((BIGNUM *)_i);
        if (iVar1 == 0) {
          _i->neg = num;
        }
        *outp = (BIGNUM *)_i;
      }
    }
  }
  return outp_local._4_4_;
}

Assistant:

static int bn_x2bn(BIGNUM **outp, const char *in, decode_func decode,
                   char_test_func want_char) {
  BIGNUM *ret = NULL;
  int neg = 0, i;
  int num;

  if (in == NULL || *in == 0) {
    return 0;
  }

  if (*in == '-') {
    neg = 1;
    in++;
  }

  for (i = 0; want_char((unsigned char)in[i]) && i + neg < INT_MAX; i++) {
  }

  num = i + neg;
  if (outp == NULL) {
    return num;
  }

  // in is the start of the hex digits, and it is 'i' long
  if (*outp == NULL) {
    ret = BN_new();
    if (ret == NULL) {
      return 0;
    }
  } else {
    ret = *outp;
    BN_zero(ret);
  }

  if (!decode(ret, in, i)) {
    goto err;
  }

  bn_set_minimal_width(ret);
  if (!BN_is_zero(ret)) {
    ret->neg = neg;
  }

  *outp = ret;
  return num;

err:
  if (*outp == NULL) {
    BN_free(ret);
  }

  return 0;
}